

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  size_type __n;
  string *input_stream;
  pointer ppVar9;
  bool bVar10;
  int num_order;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> viterbi_path;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  query_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  reference_vectors;
  vector<double,_std::allocator<double>_> tmp_2;
  double total_score;
  DynamicTimeWarping dynamic_time_warping;
  ostringstream error_message;
  int local_4b4;
  DistanceMetrics local_4b0;
  LocalPathConstraints local_4ac;
  string local_4a8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_488;
  char *local_468;
  char *local_460;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_458;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_438;
  string local_418 [3];
  ios_base local_3a8 [264];
  double local_2a0;
  DynamicTimeWarping local_298;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_4b4 = 0x19;
  local_4ac = kType4;
  local_4b0 = kEuclidean;
  local_468 = (char *)0x0;
  local_460 = (char *)0x0;
LAB_001037ef:
  while (iVar4 = ya_getopt_long(argc,argv,"l:m:p:d:P:S:h",(option *)0x0,(int *)0x0), iVar4 < 100) {
    if (iVar4 == -1) {
      if (argc - ya_optind == 1) {
        lVar8 = (long)argc + -1;
        pcVar7 = (char *)0x0;
      }
      else {
        if (argc - ya_optind != 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"Just two input files, file1 and infile, are required",
                     0x34);
          local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
          sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
          goto LAB_00103cd7;
        }
        lVar8 = (long)argc + -2;
        pcVar7 = argv[(long)argc + -1];
      }
      pcVar1 = argv[lVar8];
      bVar2 = sptk::SetBinaryMode();
      if (bVar2) {
        lVar8 = (long)local_4b4;
        local_438.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_438.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::ifstream::ifstream(&local_238);
        std::ifstream::open((char *)&local_238,(_Ios_Openmode)pcVar1);
        if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
          __n = lVar8 + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_418,__n,
                     (allocator_type *)&local_298);
          while( true ) {
            iVar4 = (int)__n;
            bVar2 = sptk::ReadStream<double>
                              (false,0,0,iVar4,(vector<double,_std::allocator<double>_> *)local_418,
                               (istream *)&local_238,(int *)0x0);
            if (!bVar2) break;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&local_438,(value_type *)local_418);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418[0]._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_418[0]._M_dataplus._M_p);
          }
          std::ifstream::~ifstream(&local_238);
          local_458.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_458.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_458.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          input_stream = &local_238;
          std::ifstream::ifstream(input_stream);
          if ((pcVar7 == (char *)0x0) ||
             (std::ifstream::open((char *)&local_238,(_Ios_Openmode)pcVar7),
             (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
            cVar3 = std::__basic_file<char>::is_open();
            if (cVar3 == '\0') {
              input_stream = (string *)&std::cin;
            }
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)local_418,__n,
                       (allocator_type *)&local_298);
            while (bVar2 = sptk::ReadStream<double>
                                     (false,0,0,iVar4,
                                      (vector<double,_std::allocator<double>_> *)local_418,
                                      (istream *)input_stream,(int *)0x0), bVar2) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::push_back(&local_458,(value_type *)local_418);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418[0]._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_418[0]._M_dataplus._M_p);
            }
            std::ifstream::~ifstream(&local_238);
            sptk::DynamicTimeWarping::DynamicTimeWarping(&local_298,local_4b4,local_4ac,local_4b0);
            if (local_298.is_valid_ == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_238,"Failed to initialize DynamicTimeWarping",0x27);
              local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
              sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
                operator_delete(local_418[0]._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
              std::ios_base::~ios_base(local_1c8);
              iVar4 = 1;
            }
            else {
              local_488.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x0;
              local_488.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
              local_488.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar2 = sptk::DynamicTimeWarping::Run
                                (&local_298,&local_458,&local_438,&local_488,&local_2a0);
              if (bVar2) {
                ppVar9 = local_488.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (local_488.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_488.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  do {
                    bVar2 = sptk::WriteStream<double>
                                      (0,iVar4,local_458.
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                               ppVar9->first,(ostream *)&std::cout,(int *)0x0);
                    if ((!bVar2) ||
                       (bVar2 = sptk::WriteStream<double>
                                          (0,iVar4,local_438.
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  ppVar9->second,(ostream *)&std::cout,(int *)0x0),
                       !bVar2)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_238,"Failed to write warped vector",0x1d);
                      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
                      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
                      goto LAB_0010448f;
                    }
                    ppVar9 = ppVar9 + 1;
                  } while (ppVar9 != local_488.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                }
                pcVar1 = local_460;
                pcVar7 = local_468;
                if (local_468 != (char *)0x0) {
                  std::ofstream::ofstream(&local_238);
                  std::ofstream::open((char *)&local_238,(_Ios_Openmode)pcVar7);
                  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
                    if (local_488.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        local_488.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      ppVar9 = local_488.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      do {
                        bVar2 = sptk::WriteStream<int>(ppVar9->first,(ostream *)&local_238);
                        if ((!bVar2) ||
                           (bVar2 = sptk::WriteStream<int>(ppVar9->second,(ostream *)&local_238),
                           !bVar2)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_418,"Failed to write Viterbi path",0x1c);
                          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_4a8,"dtw","");
                          sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_418);
                          goto LAB_001046b6;
                        }
                        ppVar9 = ppVar9 + 1;
                      } while (ppVar9 != local_488.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                    }
                    std::ofstream::~ofstream(&local_238);
                    goto LAB_0010451a;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_418,"Cannot open file ",0x11);
                  sVar5 = strlen(pcVar7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_418,pcVar7,sVar5);
                  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
                  sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_418);
LAB_001046b6:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                    operator_delete(local_4a8._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
                  std::ios_base::~ios_base(local_3a8);
                  std::ofstream::~ofstream(&local_238);
                  goto LAB_001046f3;
                }
LAB_0010451a:
                iVar4 = 0;
                if (pcVar1 != (char *)0x0) {
                  std::ofstream::ofstream(&local_238);
                  std::ofstream::open((char *)&local_238,(_Ios_Openmode)pcVar1);
                  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
                    bVar2 = sptk::WriteStream<double>(local_2a0,(ostream *)&local_238);
                    if (bVar2) {
                      std::ofstream::~ofstream(&local_238);
                      goto LAB_001046f8;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_418,"Failed to write total score",0x1b);
                    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
                    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_418);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_418,"Cannot open file ",0x11);
                    sVar5 = strlen(pcVar1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_418,pcVar1,sVar5);
                    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
                    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_418);
                  }
                  goto LAB_001046b6;
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_238,"Failed to perform dynamic time warping",0x26);
                local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
                sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
LAB_0010448f:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
                  operator_delete(local_418[0]._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
                std::ios_base::~ios_base(local_1c8);
LAB_001046f3:
                iVar4 = 1;
              }
LAB_001046f8:
              if (local_488.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_488.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            sptk::DynamicTimeWarping::~DynamicTimeWarping(&local_298);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_418,"Cannot open file ",0x11);
            sVar5 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,pcVar7,sVar5);
            local_298._vptr_DynamicTimeWarping = (_func_int **)&local_298.distance_calculation_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"dtw","");
            sptk::PrintErrorMessage((string *)&local_298,(ostringstream *)local_418);
            if ((DistanceCalculation *)local_298._vptr_DynamicTimeWarping !=
                &local_298.distance_calculation_) {
              operator_delete(local_298._vptr_DynamicTimeWarping);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
            std::ios_base::~ios_base(local_3a8);
            std::ifstream::~ifstream(&local_238);
            iVar4 = 1;
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_458);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_418,"Cannot open file ",0x11);
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffb38 +
                            (int)*(undefined8 *)(local_418[0]._M_dataplus._M_p + -0x18) + 0xb0);
          }
          else {
            sVar5 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,pcVar1,sVar5);
          }
          local_298._vptr_DynamicTimeWarping = (_func_int **)&local_298.distance_calculation_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"dtw","");
          sptk::PrintErrorMessage((string *)&local_298,(ostringstream *)local_418);
          if ((DistanceCalculation *)local_298._vptr_DynamicTimeWarping !=
              &local_298.distance_calculation_) {
            operator_delete(local_298._vptr_DynamicTimeWarping);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
          std::ios_base::~ios_base(local_3a8);
          std::ifstream::~ifstream(&local_238);
          iVar4 = 1;
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_438);
        return iVar4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Cannot set translation mode",0x1b);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
      goto LAB_00103cd7;
    }
    if (iVar4 == 0x50) {
      local_468 = ya_optarg;
    }
    else {
      if (iVar4 != 0x53) goto switchD_00103822_caseD_69;
      local_460 = ya_optarg;
    }
  }
  switch(iVar4) {
  case 0x68:
    anon_unknown.dwarf_4611::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
    goto switchD_00103822_caseD_69;
  case 0x6c:
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
    bVar10 = sptk::ConvertStringToInteger(&local_238,&local_4b4);
    bVar2 = local_4b4 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar10 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -l option must be a positive integer",
                 0x39);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
      goto LAB_00103cd7;
    }
    local_4b4 = local_4b4 + -1;
    goto LAB_001037ef;
  case 0x6d:
    break;
  case 0x70:
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
    bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_298);
    if (bVar2) {
      bVar2 = sptk::IsInRange((DistanceMetrics)local_298._vptr_DynamicTimeWarping,0,6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar2) {
        local_4ac = (DistanceMetrics)local_298._vptr_DynamicTimeWarping;
        goto LAB_001037ef;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"The argument for the -p option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"in the range of ",0x10);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
    std::ostream::operator<<((ostream *)poVar6,6);
    local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
    sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
    goto LAB_00103cd7;
  default:
    if (iVar4 == 100) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_298);
      if (bVar2) {
        bVar2 = sptk::IsInRange((DistanceMetrics)local_298._vptr_DynamicTimeWarping,0,3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar2) {
          local_4b0 = (DistanceMetrics)local_298._vptr_DynamicTimeWarping;
          goto LAB_001037ef;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -d option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
      std::ostream::operator<<((ostream *)poVar6,3);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
      goto LAB_00103cd7;
    }
switchD_00103822_caseD_69:
    anon_unknown.dwarf_4611::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
  bVar2 = sptk::ConvertStringToInteger(&local_238,&local_4b4);
  bVar10 = local_4b4 < 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (!bVar2 || bVar10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"non-negative integer",0x14);
    local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dtw","");
    sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
LAB_00103cd7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
      operator_delete(local_418[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  goto LAB_001037ef;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  sptk::DynamicTimeWarping::LocalPathConstraints local_path_constraint(
      kDefaultLocalPathConstraint);
  sptk::DistanceCalculation::DistanceMetrics distance_metric(
      kDefaultDistanceMetric);
  const char* total_score_file(NULL);
  const char* viterbi_path_file(NULL);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:d:P:S:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DynamicTimeWarping::LocalPathConstraints::kNumTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -p option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        local_path_constraint =
            static_cast<sptk::DynamicTimeWarping::LocalPathConstraints>(tmp);
        break;
      }
      case 'd': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DistanceCalculation::DistanceMetrics::kNumMetrics) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        distance_metric =
            static_cast<sptk::DistanceCalculation::DistanceMetrics>(tmp);
        break;
      }
      case 'P': {
        viterbi_path_file = optarg;
        break;
      }
      case 'S': {
        total_score_file = optarg;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }
  const int length(num_order + 1);

  std::vector<std::vector<double> > reference_vectors;
  {
    std::ifstream ifs;
    ifs.open(reference_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << reference_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      reference_vectors.push_back(tmp);
    }
  }

  std::vector<std::vector<double> > query_vectors;
  {
    std::ifstream ifs;
    if (NULL != query_file) {
      ifs.open(query_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << query_file;
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      query_vectors.push_back(tmp);
    }
  }

  sptk::DynamicTimeWarping dynamic_time_warping(
      num_order, local_path_constraint, distance_metric);
  if (!dynamic_time_warping.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DynamicTimeWarping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  std::vector<std::pair<int, int> > viterbi_path;
  double total_score;
  if (!dynamic_time_warping.Run(query_vectors, reference_vectors, &viterbi_path,
                                &total_score)) {
    std::ostringstream error_message;
    error_message << "Failed to perform dynamic time warping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
       itr != viterbi_path.end(); ++itr) {
    if (!sptk::WriteStream(0, length, query_vectors[itr->first], &std::cout,
                           NULL) ||
        !sptk::WriteStream(0, length, reference_vectors[itr->second],
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write warped vector";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  if (NULL != viterbi_path_file) {
    std::ofstream ofs;
    ofs.open(viterbi_path_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << viterbi_path_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
         itr != viterbi_path.end(); ++itr) {
      if (!sptk::WriteStream(itr->first, &output_stream) ||
          !sptk::WriteStream(itr->second, &output_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to write Viterbi path";
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
  }

  if (NULL != total_score_file) {
    std::ofstream ofs;
    ofs.open(total_score_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_score_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_score, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total score";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  return 0;
}